

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

void Iso_ManBreakTies(Iso_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int local_2c;
  int LevelStart;
  int i;
  Iso_Obj_t *pTemp;
  Iso_Obj_t *pIso;
  int fUseOneBest;
  int fVerbose_local;
  Iso_Man_t *p_local;
  
  puVar3 = (uint *)Vec_PtrEntry(p->vClasses,0);
  uVar1 = *puVar3;
  if (fVerbose != 0) {
    printf("Best level %d\n",(ulong)(uVar1 & 0x3fffffff));
  }
  local_2c = 0;
  while ((iVar2 = Vec_PtrSize(p->vClasses), local_2c < iVar2 &&
         (_LevelStart = (Iso_Obj_t *)Vec_PtrEntry(p->vClasses,local_2c),
         (uVar1 & 0x3fffffff) <= (*(uint *)_LevelStart & 0x3fffffff)))) {
    for (; _LevelStart != (Iso_Obj_t *)0x0; _LevelStart = Iso_ManObj(p,_LevelStart->iClass)) {
      if (_LevelStart->Id != 0) {
        __assert_fail("pTemp->Id == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                      ,0x424,"void Iso_ManBreakTies(Iso_Man_t *, int)");
      }
      iVar2 = p->nObjIds;
      p->nObjIds = iVar2 + 1;
      _LevelStart->Id = iVar2;
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Iso_ManBreakTies( Iso_Man_t * p, int fVerbose )
{
    int fUseOneBest = 0;
    Iso_Obj_t * pIso, * pTemp;
    int i, LevelStart = 0;
    pIso = (Iso_Obj_t *)Vec_PtrEntry( p->vClasses, 0 );
    LevelStart = pIso->Level;
    if ( fVerbose )
        printf( "Best level %d\n", LevelStart ); 
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        if ( (int)pIso->Level < LevelStart )
            break;
        if ( !fUseOneBest )
        {
            for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            {
                assert( pTemp->Id ==  0 );
                pTemp->Id = p->nObjIds++;
            }
            continue;
        }
        if ( pIso->Level == 0 )//&& pIso->nFoutPos + pIso->nFoutNeg == 0 )
        {
            for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
                pTemp->Id = p->nObjIds++;
            continue;
        }
        pIso = Iso_ManFindBestObj( p, pIso );
        pIso->Id = p->nObjIds++;
    }
}